

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O0

void xmrig::Workers<xmrig::CpuLaunchData>::onReady(void *arg)

{
  uint uVar1;
  int iVar2;
  IWorker *worker_00;
  char *pcVar3;
  undefined4 extraout_var;
  IBackend *pIVar4;
  Thread<xmrig::CpuLaunchData> *in_RDI;
  IWorker *worker;
  Thread<xmrig::CpuLaunchData> *handle;
  Thread<xmrig::CpuLaunchData> *in_stack_00000068;
  
  worker_00 = create(in_stack_00000068);
  if ((worker_00 == (IWorker *)0x0) || (uVar1 = (*worker_00->_vptr_IWorker[2])(), (uVar1 & 1) == 0))
  {
    pcVar3 = CpuLaunchData::tag();
    iVar2 = (*worker_00->_vptr_IWorker[4])();
    Log::print(ERR,
               "%s \x1b[0;31mthread \x1b[0m\x1b[1;31m#%zu\x1b[0m\x1b[0;31m self-test failed\x1b[0m",
               pcVar3,CONCAT44(extraout_var,iVar2));
    pIVar4 = Thread<xmrig::CpuLaunchData>::backend(in_RDI);
    (*pIVar4->_vptr_IBackend[10])(pIVar4,worker_00,0);
    if (worker_00 != (IWorker *)0x0) {
      (*worker_00->_vptr_IWorker[1])();
    }
  }
  else {
    Thread<xmrig::CpuLaunchData>::setWorker(in_RDI,worker_00);
    pIVar4 = Thread<xmrig::CpuLaunchData>::backend(in_RDI);
    (*pIVar4->_vptr_IBackend[10])(pIVar4,worker_00,1);
  }
  return;
}

Assistant:

void xmrig::Workers<T>::onReady(void *arg)
{
    auto handle = static_cast<Thread<T>* >(arg);

    IWorker *worker = create(handle);
    assert(worker != nullptr);

    if (!worker || !worker->selfTest()) {
        LOG_ERR("%s " RED("thread ") RED_BOLD("#%zu") RED(" self-test failed"), T::tag(), worker->id());

        handle->backend()->start(worker, false);
        delete worker;

        return;
    }

    assert(handle->backend() != nullptr);

    handle->setWorker(worker);
    handle->backend()->start(worker, true);
}